

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckType
          (SharedValidator *this,Location *loc,Type actual,Type expected,char *desc)

{
  bool bVar1;
  Result result;
  char *pcVar2;
  char *pcVar3;
  char *desc_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type local_10;
  Type expected_local;
  Type actual_local;
  
  this_local._4_4_ = expected.enum_;
  local_10.enum_ = actual.enum_;
  result = TypeChecker::CheckType(actual,expected);
  bVar1 = Failed(result);
  if (bVar1) {
    pcVar2 = Type::GetName(&local_10);
    pcVar3 = Type::GetName((Type *)((long)&this_local + 4));
    PrintError(this,loc,"type mismatch at %s. got %s, expected %s",desc,pcVar2,pcVar3);
    Result::Result((Result *)&expected_local,Error);
  }
  else {
    Result::Result((Result *)&expected_local,Ok);
  }
  return (Result)expected_local.enum_;
}

Assistant:

Result SharedValidator::CheckType(const Location& loc,
                                  Type actual,
                                  Type expected,
                                  const char* desc) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc, "type mismatch at %s. got %s, expected %s", desc,
               actual.GetName(), expected.GetName());
    return Result::Error;
  }
  return Result::Ok;
}